

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::__fastpack22(uint64_t *in,uint32_t *out)

{
  Unroller<(unsigned_short)22,_(unsigned_short)0>::Pack(in,out);
  return;
}

Assistant:

void __fastpack22(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<22>::Pack(in, out);
}